

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

int __thiscall re2::Compiler::AddSuffixRecursive(Compiler *this,int root,int id)

{
  uint uVar1;
  Inst *pIVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Frag FVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  if ((this->inst_[root].out_opcode_ & 5) != 0) {
    __assert_fail("inst_[root].opcode() == kInstAlt || inst_[root].opcode() == kInstByteRange",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",
                  0x215,"int re2::Compiler::AddSuffixRecursive(int, int)");
  }
  FVar6 = FindByteRange(this,root,id);
  uVar8 = (ulong)FVar6 & 0xffffffff;
  if (uVar8 == 0) {
    uVar9 = AllocInst(this,1);
    if (-1 < (int)uVar9) {
      Prog::Inst::InitAlt(this->inst_ + uVar9,root,id);
      return uVar9;
    }
  }
  else {
    uVar7 = (ulong)FVar6 >> 0x20;
    uVar9 = root;
    if (uVar7 != 0) {
      uVar9 = this->inst_[uVar8].out_opcode_;
      if ((uVar7 & 1) == 0) {
        uVar9 = uVar9 >> 4;
      }
      else {
        if ((uVar9 & 6) != 0) {
          __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                        ,0x6d,"int re2::Prog::Inst::out1()");
        }
        uVar9 = this->inst_[uVar8].field_1.cap_;
      }
    }
    bVar3 = IsCachedRuneByteSuffix(this,uVar9);
    if (bVar3) {
      uVar4 = AllocInst(this,1);
      uVar1 = root;
      if (-1 < (int)uVar4) {
        pIVar2 = this->inst_;
        if ((pIVar2[(int)uVar9].out_opcode_ & 7) != 2) {
          __assert_fail("(opcode()) == (kInstByteRange)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                        ,0x6f,"int re2::Prog::Inst::lo()");
        }
        Prog::Inst::InitByteRange
                  (pIVar2 + uVar4,(uint)pIVar2[(int)uVar9].field_1.field_3.lo_,
                   (uint)pIVar2[(int)uVar9].field_1.field_3.hi_,
                   (uint)pIVar2[(int)uVar9].field_1.field_3.foldcase_,
                   pIVar2[(int)uVar9].out_opcode_ >> 4);
        uVar1 = uVar4;
        uVar9 = uVar4;
        if (uVar7 != 0) {
          pIVar2 = this->inst_;
          if ((uVar7 & 1) == 0) {
            pIVar2[uVar8].out_opcode_ = pIVar2[uVar8].out_opcode_ & 0xf | uVar4 << 4;
            uVar1 = root;
          }
          else {
            pIVar2[uVar8].field_1.cap_ = uVar4;
            uVar1 = root;
          }
        }
      }
      root = uVar1;
      if ((int)uVar4 < 0) {
        return 0;
      }
    }
    uVar1 = this->inst_[id].out_opcode_;
    bVar3 = IsCachedRuneByteSuffix(this,id);
    if (!bVar3) {
      if (this->inst_len_ + -1 != id) {
        __assert_fail("(id) == (inst_len_-1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc"
                      ,0x23f,"int re2::Compiler::AddSuffixRecursive(int, int)");
      }
      pIVar2 = this->inst_;
      pIVar2[id].out_opcode_ = 0;
      pIVar2[id].field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
      this->inst_len_ = this->inst_len_ + -1;
    }
    iVar5 = AddSuffixRecursive(this,this->inst_[(int)uVar9].out_opcode_ >> 4,uVar1 >> 4);
    if (iVar5 != 0) {
      this->inst_[(int)uVar9].out_opcode_ = this->inst_[(int)uVar9].out_opcode_ & 0xf | iVar5 << 4;
      return root;
    }
  }
  return 0;
}

Assistant:

int Compiler::AddSuffixRecursive(int root, int id) {
  DCHECK(inst_[root].opcode() == kInstAlt ||
         inst_[root].opcode() == kInstByteRange);

  Frag f = FindByteRange(root, id);
  if (IsNoMatch(f)) {
    int alt = AllocInst(1);
    if (alt < 0)
      return 0;
    inst_[alt].InitAlt(root, id);
    return alt;
  }

  int br;
  if (f.end.p == 0)
    br = root;
  else if (f.end.p&1)
    br = inst_[f.begin].out1();
  else
    br = inst_[f.begin].out();

  if (IsCachedRuneByteSuffix(br)) {
    // We can't fiddle with cached suffixes, so make a clone of the head.
    int byterange = AllocInst(1);
    if (byterange < 0)
      return 0;
    inst_[byterange].InitByteRange(inst_[br].lo(), inst_[br].hi(),
                                   inst_[br].foldcase(), inst_[br].out());

    // Ensure that the parent points to the clone, not to the original.
    // Note that this could leave the head unreachable except via the cache.
    br = byterange;
    if (f.end.p == 0)
      root = br;
    else if (f.end.p&1)
      inst_[f.begin].out1_ = br;
    else
      inst_[f.begin].set_out(br);
  }

  int out = inst_[id].out();
  if (!IsCachedRuneByteSuffix(id)) {
    // The head should be the instruction most recently allocated, so free it
    // instead of leaving it unreachable.
    DCHECK_EQ(id, inst_len_-1);
    inst_[id].out_opcode_ = 0;
    inst_[id].out1_ = 0;
    inst_len_--;
  }

  out = AddSuffixRecursive(inst_[br].out(), out);
  if (out == 0)
    return 0;

  inst_[br].set_out(out);
  return root;
}